

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_must(lyout *out,int level,lys_module *module,lys_restr *must)

{
  uint in_EAX;
  char *text;
  undefined8 uStack_38;
  int content;
  
  uStack_38 = (ulong)in_EAX;
  text = transform_json2schema(module,must->expr);
  if (text != (char *)0x0) {
    ly_print(out,"%*s<must condition=\"",(ulong)(uint)(level * 2),"");
    lyxml_dump_text(out,text,LYXML_DATA_ATTR);
    ly_print(out,"\"");
    lydict_remove(module->ctx,text);
    yin_print_restr(out,level + 1,module,must,(int *)((long)&uStack_38 + 4));
    yin_print_close(out,level,(char *)0x0,"must",uStack_38._4_4_);
    return;
  }
  ly_print(out,"(!error!)");
  return;
}

Assistant:

static void
yin_print_must(struct lyout *out, int level, const struct lys_module *module, const struct lys_restr *must)
{
    const char *str;
    int content = 0;

    str = transform_json2schema(module, must->expr);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*s<must condition=\"", LEVEL, INDENT);
    lyxml_dump_text(out, str, LYXML_DATA_ATTR);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    yin_print_restr(out, level + 1, module, must, &content);
    yin_print_close(out, level, NULL, "must", content);
}